

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

vec4 __thiscall vera::Triangle::getClosestRGBSignedDistance(Triangle *this,vec3 *_p)

{
  float fVar1;
  float fVar2;
  vec3 vVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec4 vVar5;
  vec4 vVar6;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_a8;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec3 local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  vec3 local_30;
  
  vVar3 = getClosestPoint(this,_p);
  local_30.field_2 = vVar3.field_2;
  local_30._0_8_ = vVar3._0_8_;
  vVar3 = getBarycentricOf(this,&local_30);
  local_50.field_2 = vVar3.field_2;
  local_50._0_8_ = vVar3._0_8_;
  vVar5 = getColor(this,&local_50);
  vVar4 = glm::operator-(_p,&local_30);
  local_60.field_2 = vVar4.field_2;
  local_60._0_8_ = vVar4._0_8_;
  fVar1 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_60);
  vVar3 = getNormal(this,&local_50);
  local_40.field_2 = vVar3.field_2;
  local_40._0_8_ = vVar3._0_8_;
  vVar4 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_60);
  local_70.field_2 = vVar4.field_2;
  local_70._0_8_ = vVar4._0_8_;
  vVar4 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_40);
  local_80.field_2 = vVar4.field_2;
  local_80._0_8_ = vVar4._0_8_;
  fVar2 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    (&local_70,&local_80);
  local_a8 = vVar5.field_2;
  vVar6.field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (~-(uint)(0.0 <= fVar2) & (uint)-fVar1 | (uint)fVar1 & -(uint)(0.0 <= fVar2));
  vVar6.field_2 = local_a8;
  vVar6.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)vVar5._0_8_;
  vVar6.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar5._0_8_ >> 0x20);
  return vVar6;
}

Assistant:

glm::vec4 Triangle::getClosestRGBSignedDistance(const glm::vec3& _p) const {
    glm::vec3 nearest = glm::vec3(0.0);
    glm::vec3 pseudo_normal = getNormal();

    nearest = getClosestPoint(_p);

    glm::vec3 barycentric = getBarycentricOf(nearest);
    glm::vec4 c = getColor( barycentric );

    glm::vec3 u = _p - nearest;
    c.a = glm::length(u);
    // c.a = unsignedDistance(_p);

    pseudo_normal = getNormal( barycentric );

    c.a = (glm::dot( glm::normalize(u), glm::normalize(pseudo_normal) ) >= 0.0)? c.a : -c.a; 
    // c.a *= glm::sign( glm::dot(_p, m_normal) - glm::dot(m_vertices[0], m_normal) );

    return c;
}